

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O0

void __thiscall
prevector<35U,_unsigned_char,_unsigned_int,_int>::change_capacity
          (prevector<35U,_unsigned_char,_unsigned_int,_int> *this,size_type new_capacity)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  uchar *__src;
  uchar *__dest;
  void *pvVar4;
  prevector<35U,_unsigned_char,_unsigned_int,_int> *this_00;
  uint in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  uchar *dst_1;
  uchar *src_1;
  char *new_indirect;
  uchar *dst;
  uchar *src;
  uchar *indirect;
  prevector<35U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  difference_type_conflict pos;
  void *__dest_00;
  prevector<35U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff98;
  
  pos = (difference_type_conflict)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI < 0x24) {
    bVar2 = is_direct(in_stack_ffffffffffffff88);
    if (!bVar2) {
      __src = indirect_ptr(in_stack_ffffffffffffff98,pos);
      __dest = direct_ptr(in_stack_ffffffffffffff98,pos);
      sVar3 = size(in_stack_ffffffffffffff98);
      memcpy(__dest,__src,(ulong)sVar3);
      free(__src);
      *(int *)((long)in_RDI + 0x24) = *(int *)((long)in_RDI + 0x24) + -0x24;
    }
  }
  else {
    bVar2 = is_direct(in_stack_ffffffffffffff88);
    if (bVar2) {
      pvVar4 = malloc((ulong)in_ESI);
      if (pvVar4 == (void *)0x0) {
        __assert_fail("new_indirect",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/prevector.h"
                      ,0xc3,
                      "void prevector<35, unsigned char>::change_capacity(size_type) [N = 35, T = unsigned char, Size = unsigned int, Diff = int]"
                     );
      }
      this_00 = (prevector<35U,_unsigned_char,_unsigned_int,_int> *)
                direct_ptr(in_stack_ffffffffffffff98,pos);
      __dest_00 = pvVar4;
      sVar3 = size(this_00);
      memcpy(__dest_00,this_00,(ulong)sVar3);
      *in_RDI = (long)pvVar4;
      *(uint *)(in_RDI + 1) = in_ESI;
      *(int *)((long)in_RDI + 0x24) = *(int *)((long)in_RDI + 0x24) + 0x24;
    }
    else {
      pvVar4 = realloc((void *)*in_RDI,(ulong)in_ESI);
      *in_RDI = (long)pvVar4;
      if (*in_RDI == 0) {
        __assert_fail("_union.indirect_contents.indirect",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/prevector.h"
                      ,0xbf,
                      "void prevector<35, unsigned char>::change_capacity(size_type) [N = 35, T = unsigned char, Size = unsigned int, Diff = int]"
                     );
      }
      *(uint *)(in_RDI + 1) = in_ESI;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void change_capacity(size_type new_capacity) {
        if (new_capacity <= N) {
            if (!is_direct()) {
                T* indirect = indirect_ptr(0);
                T* src = indirect;
                T* dst = direct_ptr(0);
                memcpy(dst, src, size() * sizeof(T));
                free(indirect);
                _size -= N + 1;
            }
        } else {
            if (!is_direct()) {
                /* FIXME: Because malloc/realloc here won't call new_handler if allocation fails, assert
                    success. These should instead use an allocator or new/delete so that handlers
                    are called as necessary, but performance would be slightly degraded by doing so. */
                _union.indirect_contents.indirect = static_cast<char*>(realloc(_union.indirect_contents.indirect, ((size_t)sizeof(T)) * new_capacity));
                assert(_union.indirect_contents.indirect);
                _union.indirect_contents.capacity = new_capacity;
            } else {
                char* new_indirect = static_cast<char*>(malloc(((size_t)sizeof(T)) * new_capacity));
                assert(new_indirect);
                T* src = direct_ptr(0);
                T* dst = reinterpret_cast<T*>(new_indirect);
                memcpy(dst, src, size() * sizeof(T));
                _union.indirect_contents.indirect = new_indirect;
                _union.indirect_contents.capacity = new_capacity;
                _size += N + 1;
            }
        }
    }